

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool __thiscall cmCTestTestHandler::SetTestOutputTruncation(cmCTestTestHandler *this,string *mode)

{
  bool bVar1;
  string *mode_local;
  cmCTestTestHandler *this_local;
  
  bVar1 = std::operator==(mode,"tail");
  if (bVar1) {
    this->TestOutputTruncation = Tail;
  }
  else {
    bVar1 = std::operator==(mode,"middle");
    if (bVar1) {
      this->TestOutputTruncation = Middle;
    }
    else {
      bVar1 = std::operator==(mode,"head");
      if (!bVar1) {
        return false;
      }
      this->TestOutputTruncation = Head;
    }
  }
  return true;
}

Assistant:

bool cmCTestTestHandler::SetTestOutputTruncation(const std::string& mode)
{
  if (mode == "tail") {
    this->TestOutputTruncation = cmCTestTypes::TruncationMode::Tail;
  } else if (mode == "middle") {
    this->TestOutputTruncation = cmCTestTypes::TruncationMode::Middle;
  } else if (mode == "head") {
    this->TestOutputTruncation = cmCTestTypes::TruncationMode::Head;
  } else {
    return false;
  }
  return true;
}